

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodePtr xmlXPathNextNamespace(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlXPathContextPtr pxVar1;
  int iVar2;
  uint uVar3;
  xmlNsPtr *ppxVar4;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  pxVar1 = ctxt->context;
  if ((pxVar1 != (xmlXPathContextPtr)0x0) && (pxVar1->node->type == XML_ELEMENT_NODE)) {
    if (cur == (xmlNodePtr)0x0) {
      if (pxVar1->tmpNsList != (xmlNsPtr *)0x0) {
        (*xmlFree)(pxVar1->tmpNsList);
      }
      pxVar1 = ctxt->context;
      pxVar1->tmpNsNr = 0;
      iVar2 = xmlGetNsListSafe(pxVar1->doc,pxVar1->node,&pxVar1->tmpNsList);
      if (-1 < iVar2) {
        pxVar1 = ctxt->context;
        ppxVar4 = pxVar1->tmpNsList;
        if (ppxVar4 == (xmlNsPtr *)0x0) {
          return (xmlNodePtr)&xmlXPathXMLNamespaceStruct;
        }
        iVar2 = pxVar1->tmpNsNr;
        if (ppxVar4[iVar2] == (xmlNsPtr)0x0) {
          return (xmlNodePtr)&xmlXPathXMLNamespaceStruct;
        }
        ppxVar4 = ppxVar4 + iVar2;
        do {
          ppxVar4 = ppxVar4 + 1;
          iVar2 = iVar2 + 1;
        } while (*ppxVar4 != (xmlNsPtr)0x0);
        pxVar1->tmpNsNr = iVar2;
        return (xmlNodePtr)&xmlXPathXMLNamespaceStruct;
      }
      xmlXPathPErrMemory(ctxt);
    }
    else {
      ppxVar4 = pxVar1->tmpNsList;
      if (0 < pxVar1->tmpNsNr) {
        uVar3 = pxVar1->tmpNsNr - 1;
        pxVar1->tmpNsNr = uVar3;
        return (xmlNodePtr)ppxVar4[uVar3];
      }
      if (ppxVar4 != (xmlNsPtr *)0x0) {
        (*xmlFree)(ppxVar4);
      }
      ctxt->context->tmpNsList = (xmlNsPtr *)0x0;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextNamespace(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (ctxt->context->node->type != XML_ELEMENT_NODE) return(NULL);
    if (cur == NULL) {
        if (ctxt->context->tmpNsList != NULL)
	    xmlFree(ctxt->context->tmpNsList);
	ctxt->context->tmpNsNr = 0;
        if (xmlGetNsListSafe(ctxt->context->doc, ctxt->context->node,
                             &ctxt->context->tmpNsList) < 0) {
            xmlXPathPErrMemory(ctxt);
            return(NULL);
        }
        if (ctxt->context->tmpNsList != NULL) {
            while (ctxt->context->tmpNsList[ctxt->context->tmpNsNr] != NULL) {
                ctxt->context->tmpNsNr++;
            }
        }
	return((xmlNodePtr) xmlXPathXMLNamespace);
    }
    if (ctxt->context->tmpNsNr > 0) {
	return (xmlNodePtr)ctxt->context->tmpNsList[--ctxt->context->tmpNsNr];
    } else {
	if (ctxt->context->tmpNsList != NULL)
	    xmlFree(ctxt->context->tmpNsList);
	ctxt->context->tmpNsList = NULL;
	return(NULL);
    }
}